

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-info.c
# Opt level: O2

textblock * object_info_out(object *obj,wchar_t mode)

{
  bitflag *flags_00;
  random_value *prVar1;
  byte bVar2;
  short sVar3;
  monster_race *pmVar4;
  curse_data *pcVar5;
  ego_item *peVar6;
  _Bool *p_Var7;
  uint8_t attr;
  random_value v;
  random_value v_00;
  random_value v_01;
  player *ppVar8;
  _Bool _Var9;
  _Bool _Var10;
  _Bool _Var11;
  _Bool _Var12;
  _Bool _Var13;
  wchar_t flag;
  int iVar14;
  int iVar15;
  textblock *tb;
  artifact_set *paVar16;
  set_item *psVar17;
  angband_constants *paVar18;
  obj_property *poVar19;
  effect *peVar20;
  wchar_t *pwVar21;
  textblock *tba;
  object *poVar22;
  object *poVar23;
  int iVar24;
  long lVar25;
  wchar_t wVar26;
  ulong uVar27;
  wchar_t count;
  int iVar28;
  undefined2 uVar29;
  int iVar30;
  char *pcVar31;
  long lVar32;
  byte bVar33;
  uint uVar34;
  int iVar35;
  ulong uVar36;
  ulong uVar37;
  char *pcVar38;
  size_t sVar39;
  undefined8 *puVar40;
  wchar_t i;
  wchar_t wVar41;
  uint uVar42;
  ulong uVar43;
  int *piVar44;
  bool bVar45;
  bool bVar46;
  bool bVar47;
  bitflag flags [6];
  uint local_5b4;
  uint local_598 [8];
  element_info el_info [28];
  _Bool list [28];
  wchar_t local_48c;
  char loot_spot [80];
  _Bool local_313;
  
  tb = textblock_new();
  if (obj->known == (object *)0x0) {
    __assert_fail("obj->known",
                  "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/obj-info.c"
                  ,0x7c1,"textblock *object_info_out(const struct object *, int)");
  }
  if (obj->kind != obj->known->kind) {
    pcVar31 = "\n\nYou do not know what this is.\n";
    goto LAB_001900ea;
  }
  if ((mode & 4U) == 0) {
    object_flags_known(obj,flags);
    if ((mode & 1U) != 0) {
      flag_diff(flags,obj->kind->base->flags,6);
    }
  }
  else {
    object_flags(obj,flags);
  }
  poVar22 = player->obj_k;
  poVar23 = obj->known;
  for (lVar25 = 0; lVar25 != 0x70; lVar25 = lVar25 + 4) {
    if (((mode & 0x10U) != 0) ||
       (uVar29 = 100, *(short *)((long)&poVar22->el_info[0].res_level + lVar25) != 0)) {
      uVar29 = *(undefined2 *)((long)&poVar23->el_info[0].res_level + lVar25);
    }
    *(undefined2 *)((long)&el_info[0].res_level + lVar25) = uVar29;
    bVar33 = (&poVar23->el_info[0].flags)[lVar25];
    (&el_info[0].flags)[lVar25] = bVar33;
    bVar2 = (&obj->el_info[0].flags)[lVar25];
    if ((bVar2 & 2) != 0) {
      bVar33 = (bVar2 & 1) - 3 & bVar33;
      (&el_info[0].flags)[lVar25] = bVar33;
    }
    if ((mode & 1U) != 0) {
      (&el_info[0].flags)[lVar25] = bVar33 & 0xfe;
    }
  }
  if (((mode & 2U) == 0) || (((mode & 1U) != 0 && (_Var9 = obj_can_wear(obj), !_Var9))))
  goto switchD_0019038a_caseD_ffffffff;
  uVar34 = (uint)obj->origin;
  if ((obj->origin == 0x18) && (obj->mimicking_m_idx != 0)) {
    uVar34 = 1;
  }
  pcVar31 = level_name(world->levels + obj->origin_place);
  _Var9 = false;
  strnfmt(loot_spot,0x50,"in %s",pcVar31);
  pmVar4 = obj->origin_race;
  if (pmVar4 == (monster_race *)0x0) {
    pcVar31 = "monster lost to history";
    _Var10 = false;
  }
  else {
    pcVar31 = pmVar4->name;
    _Var9 = flag_has_dbg(pmVar4->flags,0xc,1,"obj->origin_race->flags","RF_UNIQUE");
    _Var10 = flag_has_dbg(obj->origin_race->flags,0xc,6,"obj->origin_race->flags","RF_NAME_COMMA");
  }
  _Var11 = is_a_vowel((int)*pcVar31);
  pcVar38 = "a ";
  if (_Var11) {
    pcVar38 = "an ";
  }
  if ((_Var9 == false) ||
     (_Var9 = flag_has_dbg(obj->origin_race->flags,0xc,2,"obj->origin_race->flags","RF_PLAYER_GHOST"
                          ), _Var9)) {
    my_strcpy(list,pcVar38,0x50);
    my_strcat(list,pcVar31,0x50);
  }
  else {
    my_strcpy(list,pcVar31,0x50);
  }
  if (_Var10 != false) {
    my_strcat(list,",",0x50);
  }
  uVar43 = (ulong)(uVar34 << 4);
  switch(*(undefined4 *)((long)&origins[0].args + uVar43)) {
  case 0:
    pcVar31 = *(char **)((long)&origins[0].desc + uVar43);
    pcVar38 = "%s";
    goto LAB_001903a5;
  case 1:
    pcVar38 = *(char **)((long)&origins[0].desc + uVar43);
    pcVar31 = loot_spot;
LAB_001903a5:
    textblock_append(tb,pcVar38,pcVar31);
    break;
  case 2:
    textblock_append(tb,*(char **)((long)&origins[0].desc + uVar43),list);
    break;
  case 0xffffffff:
    goto switchD_0019038a_caseD_ffffffff;
  }
  textblock_append(tb,"\n\n");
switchD_0019038a_caseD_ffffffff:
  if ((mode & 1U) == 0) {
    if (((obj->artifact != (artifact *)0x0) && (obj->known->artifact != (artifact *)0x0)) &&
       (pcVar31 = obj->artifact->text, pcVar31 != (char *)0x0)) goto LAB_00190498;
    _Var9 = object_flavor_is_aware(obj);
    if ((mode & 4U) != 0 || _Var9) {
      if ((mode & 4U) == 0) {
        pcVar38 = obj->kind->text;
        if (pcVar38 != (char *)0x0) {
          textblock_append(tb,"%s",pcVar38);
        }
        if ((obj->known->ego != (ego_item *)0x0) &&
           (pcVar31 = obj->ego->text, pcVar31 != (char *)0x0)) {
          if (pcVar38 != (char *)0x0) {
            textblock_append(tb,"  ");
            pcVar31 = obj->ego->text;
          }
          goto LAB_00190498;
        }
        if (pcVar38 != (char *)0x0) {
          textblock_append(tb,"\n\n");
        }
      }
      else {
        pcVar31 = obj->ego->text;
        if (pcVar31 != (char *)0x0) {
LAB_00190498:
          textblock_append(tb,"%s\n\n",pcVar31);
        }
      }
    }
  }
  _Var9 = object_fully_known(obj);
  if (((_Var9) || ((obj->known->notice & 2) == 0)) || (_Var9 = tval_is_useable(obj), _Var9)) {
    bVar47 = false;
  }
  else {
    textblock_append(tb,"You do not know the full extent of this item\'s powers.\n");
    bVar47 = true;
  }
  _Var9 = object_is_known_artifact(obj);
  if ((_Var9) && (paVar16 = get_artifact_set(obj->artifact), paVar16 != (artifact_set *)0x0)) {
    psVar17 = (set_item *)&paVar16->set_item;
    do {
      psVar17 = psVar17->next;
      if (psVar17 == (set_item *)0x0) goto LAB_00190536;
    } while (psVar17->aidx != obj->artifact->aidx);
    textblock_append(tb,"\n");
    textblock_append_c(tb,'\x06',"%s.\n");
    bVar47 = true;
  }
LAB_00190536:
  poVar22 = obj->known;
  pcVar5 = poVar22->curses;
  if (pcVar5 != (curse_data *)0x0) {
    lVar25 = 0xd;
    paVar18 = z_info;
    for (uVar43 = 1; uVar43 < paVar18->curse_max; uVar43 = uVar43 + 1) {
      if (pcVar5[uVar43].power != L'\0') {
        textblock_append(tb,"It ");
        textblock_append_c(tb,'\f',"%s",*(undefined8 *)(curses->conflict_flags + lVar25 * 8 + -0x28)
                          );
        if (pcVar5[uVar43].power == L'd') {
          textblock_append(tb,"; this curse cannot be removed");
        }
        else {
          textblock_append(tb," (power %d)");
        }
        textblock_append(tb,".\n");
        paVar18 = z_info;
      }
      lVar25 = lVar25 + 7;
    }
    poVar22 = obj->known;
    bVar47 = true;
  }
  peVar6 = poVar22->ego;
  bVar45 = peVar6 != (ego_item *)0x0;
  _Var9 = tval_can_have_flavor_k(obj->kind);
  if (_Var9) {
    _Var9 = object_flavor_is_aware(obj);
    bVar45 = _Var9 || peVar6 != (ego_item *)0x0;
  }
  wVar41 = L'\x01';
  poVar22 = obj->known;
  bVar33 = 0;
  lVar32 = 0;
  for (lVar25 = 0x29; lVar25 != 0x3a; lVar25 = lVar25 + 1) {
    bVar46 = *(short *)(poVar22->flags + lVar25 * 2 + -0x4c) != 0;
    bVar33 = bVar33 | bVar46;
    lVar32 = lVar32 + (ulong)bVar46;
  }
  if (lVar32 != 0) {
    for (lVar25 = 0; lVar25 != 0x11; lVar25 = lVar25 + 1) {
      poVar19 = lookup_obj_property(L'\x02',(wchar_t)lVar25);
      sVar3 = obj->known->modifiers[lVar25];
      if (sVar3 != 0) {
        if ((bool)((mode & 0xcU) == 0U & bVar33)) {
          textblock_append_c(tb,(0 < sVar3) * '\t' + '\x04',"%+i %s.\n");
        }
        else if (bVar45) {
          textblock_append(tb,"Affects your %s\n",poVar19->name);
        }
      }
    }
    poVar22 = obj->known;
    bVar47 = true;
  }
  p_Var7 = poVar22->slays;
  if (p_Var7 != (_Bool *)0x0) {
    _Var9 = tval_is_weapon(obj);
    if (_Var9) {
      pcVar31 = "Slays ";
    }
    else {
      _Var9 = tval_is_fuel(obj);
      pcVar31 = "It causes your melee attacks to slay ";
      if (_Var9) {
        pcVar31 = "Slays ";
      }
    }
    iVar28 = 0;
    textblock_append(tb,pcVar31);
    bVar33 = z_info->slay_max;
    for (uVar43 = 1; uVar43 < bVar33; uVar43 = uVar43 + 1) {
      iVar28 = iVar28 + (uint)p_Var7[uVar43];
    }
    if (iVar28 == 0) {
      __assert_fail("count >= 1",
                    "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/obj-info.c"
                    ,0x194,"_Bool describe_slays(textblock *, const struct object *)");
    }
    lVar25 = 0;
    for (uVar43 = 1; uVar43 < bVar33; uVar43 = uVar43 + 1) {
      if (p_Var7[uVar43] == true) {
        textblock_append(tb,"%s",*(undefined8 *)((long)&slays[1].name + lVar25));
        if (0x14 < *(int *)((long)&slays[1].multiplier + lVar25)) {
          textblock_append(tb," (powerfully)");
        }
        pcVar31 = ".\n";
        if (1 < iVar28) {
          pcVar31 = ", ";
        }
        textblock_append(tb,pcVar31);
        iVar28 = iVar28 + -1;
        bVar33 = z_info->slay_max;
      }
      lVar25 = lVar25 + 0x38;
    }
    poVar22 = obj->known;
    bVar47 = true;
  }
  p_Var7 = poVar22->brands;
  if (p_Var7 != (_Bool *)0x0) {
    _Var9 = tval_is_weapon(obj);
    if (_Var9) {
      pcVar31 = "Branded with ";
    }
    else {
      _Var9 = tval_is_fuel(obj);
      pcVar31 = "It brands your melee attacks with ";
      if (_Var9) {
        pcVar31 = "Branded with ";
      }
    }
    iVar28 = 0;
    textblock_append(tb,pcVar31);
    uVar36 = (ulong)z_info->brand_max;
    for (uVar43 = 1; uVar43 < z_info->brand_max; uVar43 = uVar43 + 1) {
      iVar28 = iVar28 + (uint)p_Var7[uVar43];
    }
    if (iVar28 == 0) {
      __assert_fail("count >= 1",
                    "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/obj-info.c"
                    ,0x1ba,"_Bool describe_brands(textblock *, const struct object *)");
    }
    lVar25 = 0;
    for (uVar43 = 1; uVar43 < uVar36; uVar43 = uVar43 + 1) {
      if (p_Var7[uVar43] == true) {
        if (*(int *)((long)&brands[1].multiplier + lVar25) < 0xf) {
          textblock_append(tb,"weak ");
        }
        textblock_append(tb,"%s",*(undefined8 *)((long)&brands[1].name + lVar25));
        pcVar31 = ".\n";
        if (1 < iVar28) {
          pcVar31 = ", ";
        }
        textblock_append(tb,pcVar31);
        iVar28 = iVar28 + -1;
        uVar36 = (ulong)z_info->brand_max;
      }
      lVar25 = lVar25 + 0x30;
    }
    bVar47 = true;
  }
  uVar43 = 0;
  uVar36 = 0;
  uVar37 = 0;
  bVar45 = false;
  for (lVar25 = 0; lVar25 != 0x1c; lVar25 = lVar25 + 1) {
    sVar3 = el_info[lVar25].res_level;
    *(int *)(loot_spot + lVar25 * 4) = (int)sVar3;
    if (sVar3 == 0) {
      uVar36 = uVar36 + 1;
LAB_00190984:
      bVar45 = true;
    }
    else {
      if (sVar3 < 100) {
        uVar43 = uVar43 + 1;
        goto LAB_00190984;
      }
      uVar37 = uVar37 + (sVar3 != 100);
      bVar45 = (bool)(sVar3 != 100 | bVar45);
    }
  }
  if (uVar36 != 0) {
    lVar25 = 2;
    textblock_append(tb,"Provides immunity to ");
    uVar27 = 0;
    while ((uVar27 < 0x1c && (uVar36 != 0))) {
      if (*(int *)(loot_spot + uVar27 * 4) == 0) {
        textblock_append(tb,"%s",*(undefined8 *)(&projections->index + lVar25));
        if (1 < uVar36) {
          textblock_append(tb,", ");
        }
        uVar36 = uVar36 - 1;
      }
      uVar27 = uVar27 + 1;
      lVar25 = lVar25 + 0x1c;
    }
    textblock_append(tb,".\n");
  }
  if (uVar43 != 0) {
    textblock_append(tb,"Provides resistance to ");
    lVar25 = 2;
    uVar36 = 0;
    while ((uVar36 < 0x1c && (uVar43 != 0))) {
      iVar28 = *(int *)(loot_spot + uVar36 * 4);
      if (iVar28 != 0 && iVar28 < 100) {
        textblock_append(tb,"%s (%d%%)",*(undefined8 *)(&projections->index + lVar25),
                         (ulong)(100 - iVar28));
        if (1 < uVar43) {
          textblock_append(tb,", ");
        }
        uVar43 = uVar43 - 1;
      }
      uVar36 = uVar36 + 1;
      lVar25 = lVar25 + 0x1c;
    }
    textblock_append(tb,".\n");
  }
  if (uVar37 != 0) {
    textblock_append(tb,"Makes you vulnerable to ");
    lVar25 = 2;
    uVar43 = 0;
    while ((uVar43 < 0x1c && (uVar37 != 0))) {
      if (100 < *(int *)(loot_spot + uVar43 * 4)) {
        textblock_append(tb,"%s (%d%%)",*(undefined8 *)(&projections->index + lVar25),
                         (ulong)(*(int *)(loot_spot + uVar43 * 4) - 100));
        if (1 < uVar37) {
          textblock_append(tb,", ");
        }
        uVar37 = uVar37 - 1;
      }
      uVar43 = uVar43 + 1;
      lVar25 = lVar25 + 0x1c;
    }
    textblock_append(tb,".\n");
  }
  iVar28 = 0;
  for (; sVar39 = (size_t)iVar28, wVar41 != L'-'; wVar41 = wVar41 + L'\x01') {
    poVar19 = lookup_obj_property(L'\x03',wVar41);
    if ((poVar19->subtype == L'\x02') &&
       (_Var9 = flag_has_dbg(flags,6,poVar19->index,"flags","prop->index"), _Var9)) {
      iVar28 = iVar28 + 1;
      *(char **)(loot_spot + sVar39 * 8) = poVar19->desc;
    }
  }
  bVar46 = true;
  if (!bVar45) {
    bVar46 = bVar47;
  }
  if (iVar28 != 0) {
    textblock_append(tb,"Provides protection from ");
    info_out_list(tb,(char **)loot_spot,sVar39);
    bVar46 = true;
  }
  for (lVar25 = 0; lVar25 != 0x1c; lVar25 = lVar25 + 1) {
    list[lVar25] = (_Bool)(el_info[lVar25].flags >> 1 & 1);
  }
  sVar39 = element_info_collect(list,(char **)loot_spot);
  if (sVar39 != 0) {
    textblock_append(tb,"Cannot be harmed by ");
    info_out_list(tb,(char **)loot_spot,sVar39);
    bVar46 = true;
  }
  for (lVar25 = 0; lVar25 != 0x1c; lVar25 = lVar25 + 1) {
    list[lVar25] = (_Bool)(el_info[lVar25].flags & 1);
  }
  sVar39 = element_info_collect(list,(char **)loot_spot);
  if (sVar39 != 0) {
    textblock_append(tb,"Can be destroyed by ");
    info_out_list(tb,(char **)loot_spot,sVar39);
    bVar46 = true;
  }
  wVar41 = L'\x01';
  iVar28 = 0;
  for (wVar26 = L'\0'; sVar39 = (size_t)iVar28, wVar26 != L'\x05'; wVar26 = wVar26 + L'\x01') {
    poVar19 = lookup_obj_property(L'\x01',wVar26);
    flag = sustain_flag(poVar19->index);
    _Var9 = flag_has_dbg(flags,6,flag,"flags","sustain_flag(prop->index)");
    if (_Var9) {
      iVar28 = iVar28 + 1;
      *(char **)(loot_spot + sVar39 * 8) = poVar19->name;
    }
  }
  if (iVar28 != 0) {
    textblock_append(tb,"Sustains ");
    info_out_list(tb,(char **)loot_spot,sVar39);
    bVar46 = true;
  }
  bVar47 = false;
  for (; wVar41 != L'-'; wVar41 = wVar41 + L'\x01') {
    poVar19 = lookup_obj_property(L'\x03',wVar41);
    if ((((uint)poVar19->subtype < 7) && ((0x68U >> (poVar19->subtype & 0x1fU) & 1) != 0)) &&
       (_Var9 = flag_has_dbg(flags,6,poVar19->index,"flags","prop->index"), _Var9)) {
      textblock_append(tb,"%s.  ",poVar19->desc);
      bVar47 = true;
    }
  }
  if (bVar47) {
    textblock_append(tb,"\n");
    bVar46 = true;
  }
  _Var9 = tval_is_light(obj);
  if ((_Var9) || (0 < obj->modifiers[0xd])) {
    _Var10 = flag_has_dbg(obj->flags,6,0x22,"obj->flags","OF_LIGHT_2");
    iVar28 = 2;
    if (!_Var10) {
      _Var10 = flag_has_dbg(obj->flags,6,0x23,"obj->flags","OF_LIGHT_3");
      iVar28 = (uint)_Var10 + (uint)_Var10 * 2;
    }
    uVar34 = obj->known->modifiers[0xd] + iVar28;
    if (uVar34 != 0) {
      _Var10 = flag_has_dbg(obj->known->flags,6,0x19,"obj->known->flags","OF_NO_FUEL");
      bVar47 = false;
      if (!_Var10) {
        bVar47 = obj->known->artifact == (artifact *)0x0;
      }
      uVar42 = 0;
      if ((_Var9) &&
         (_Var9 = flag_has_dbg(obj->known->flags,6,0x18,"obj->known->flags","OF_TAKES_FUEL"),
         uVar42 = 0, _Var9)) {
        uVar42 = (uint)z_info->fuel_lamp;
      }
      _Var9 = tval_is_light(obj);
      bVar46 = true;
      if (_Var9) {
        textblock_append(tb,"Intensity ");
        textblock_append_c(tb,'\r',"%d",(ulong)uVar34);
        textblock_append(tb," light.");
        if (obj->artifact == (artifact *)0x0 && !bVar47) {
          textblock_append(tb,"  No fuel required.");
        }
        if ((mode & 1U) == 0) {
          if (uVar42 == 0) {
            textblock_append(tb,"  Cannot be refueled.");
          }
          else {
            textblock_append(tb,"  Refills other lanterns up to %d turns of fuel.",(ulong)uVar42);
          }
        }
        textblock_append(tb,"\n");
      }
    }
  }
  _Var9 = obj_can_browse(obj);
  if (_Var9) {
    textblock_append(tb,"\nYou can read this book.\n");
    bVar46 = true;
  }
  if ((mode & 4U) == 0) {
LAB_00191137:
    bVar45 = bVar46;
    if (bVar46) goto LAB_00191141;
  }
  else {
    peVar6 = obj->ego;
    flags_00 = peVar6->kind_flags;
    _Var9 = flag_has_dbg(flags_00,4,5,"ego->kind_flags","KF_RAND_HI_RES");
    if (_Var9) {
      pcVar31 = "It provides one random higher resistance.  ";
LAB_001910bf:
      textblock_append(tb,pcVar31);
      bVar47 = true;
    }
    else {
      _Var9 = flag_has_dbg(flags_00,4,6,"ego->kind_flags","KF_RAND_SUSTAIN");
      if (_Var9) {
        pcVar31 = "It provides one random sustain.  ";
        goto LAB_001910bf;
      }
      _Var9 = flag_has_dbg(flags_00,4,7,"ego->kind_flags","KF_RAND_POWER");
      if (_Var9) {
        pcVar31 = "It provides one random ability.  ";
        goto LAB_001910bf;
      }
      _Var9 = flag_has_dbg(flags_00,4,3,"ego->kind_flags","KF_RAND_RES");
      if (_Var9) {
        pcVar31 = "It provides one random resistance.  ";
        goto LAB_001910bf;
      }
      bVar47 = false;
    }
    _Var9 = flag_has_dbg(peVar6->flags,6,0x19,"ego->flags","OF_NO_FUEL");
    if ((_Var9) &&
       (_Var9 = flag_has_dbg(peVar6->flags_off,6,0x18,"ego->flags_off","OF_TAKES_FUEL"), _Var9)) {
      textblock_append(tb,"It burns forever without fuel.  ");
      bVar45 = true;
    }
    else {
      bVar45 = true;
      if (!bVar47) goto LAB_00191137;
    }
LAB_00191141:
    bVar46 = bVar45;
    textblock_append(tb,"\n");
  }
  if ((mode & 4U) == 0) {
    if (((mode & 1U) == 0) || (obj->artifact != (artifact *)0x0)) {
      _Var9 = object_is_in_store(obj);
      if (_Var9) {
        _Var9 = tval_is_useable(obj);
      }
      else {
        _Var9 = false;
      }
      _Var10 = object_effect_is_known(obj);
      peVar20 = object_effect(obj);
      if (_Var10 || _Var9 != false) {
        prVar1 = &obj->time;
        v_01 = *prVar1;
        v_00 = *prVar1;
        v = *prVar1;
        _Var9 = effect_aim(peVar20);
        wVar41 = L'\0';
        iVar14 = randcalc(v,0,MAXIMISE);
        iVar28 = 0;
        iVar15 = 0;
        if (0 < iVar14) {
          iVar28 = randcalc(v_00,0,MINIMISE);
          iVar15 = randcalc(v_01,0,MAXIMISE);
        }
        _Var10 = tval_is_edible(obj);
        if (((!_Var10) && (_Var10 = tval_is_potion(obj), !_Var10)) &&
           (_Var10 = tval_is_scroll(obj), !_Var10)) {
          wVar41 = get_use_device_chance(obj);
        }
        if (peVar20 == (effect *)0x0) {
LAB_001912b7:
          peVar20 = object_effect(obj);
          if (peVar20 == (effect *)0x0) {
            peVar20 = (effect *)0x0;
            goto LAB_00191301;
          }
          _Var10 = tval_is_edible(obj);
          if (_Var10) {
            textblock_append(tb,"It can be eaten.\n");
          }
          else {
            _Var10 = tval_is_potion(obj);
            if (_Var10) {
              pcVar31 = "It can be drunk.\n";
            }
            else {
              _Var10 = tval_is_scroll(obj);
              if (_Var10) {
                pcVar31 = "It can be read.\n";
              }
              else if (_Var9 == false) {
                pcVar31 = "It can be activated.\n";
              }
              else {
                pcVar31 = "It can be aimed.\n";
              }
            }
            textblock_append(tb,pcVar31);
          }
        }
        else {
LAB_00191301:
          if ((obj->activation == (activation *)0x0) || (obj->activation->desc == (char *)0x0)) {
            if (obj->artifact == (artifact *)0x0) {
              pwVar21 = &obj->kind->level;
            }
            else {
              pwVar21 = &obj->artifact->level;
            }
            iVar24 = (player->state).skills[2] - *pwVar21;
            iVar14 = 0;
            if (-2 < iVar24) {
              iVar14 = iVar24 / 2;
            }
            if (_Var9 == false) {
              _Var9 = tval_is_edible(obj);
              if (_Var9) {
                pcVar31 = "When eaten, it ";
              }
              else {
                _Var9 = tval_is_potion(obj);
                if (_Var9) {
                  pcVar31 = "When quaffed, it ";
                }
                else {
                  _Var9 = tval_is_scroll(obj);
                  pcVar31 = "When activated, it ";
                  if (_Var9) {
                    pcVar31 = "When read, it ";
                  }
                }
              }
            }
            else {
              pcVar31 = "When aimed, it ";
            }
            tba = effect_describe(peVar20,pcVar31,iVar14,false);
            if (tba == (textblock *)0x0) goto LAB_001915dc;
            textblock_append_textblock(tb,tba);
            textblock_free(tba);
          }
          else {
            textblock_append(tb,"When activated, it ");
            textblock_append(tb,"%s",obj->activation->desc);
          }
          textblock_append(tb,".\n");
          if (iVar28 != 0 || iVar15 != 0) {
            wVar26 = turn_energy((player->state).speed);
            if ((mode & 2U) == 0) {
              wVar26 = L'\n';
            }
            textblock_append(tb,"Takes ");
            uVar43 = (long)(iVar28 * wVar26) / 10;
            uVar36 = (long)(wVar26 * iVar15) / 10;
            textblock_append_c(tb,'\r',"%d",uVar43 & 0xffffffff);
            if ((int)uVar43 != (int)uVar36) {
              textblock_append(tb," to ");
              textblock_append_c(tb,'\r',"%d",uVar36 & 0xffffffff);
            }
            textblock_append(tb," turns to recharge");
            if (((mode & 2U) != 0) && ((player->state).speed != L'n')) {
              textblock_append(tb," at your current speed");
            }
            textblock_append(tb,".\n");
          }
          if (L'\0' < wVar41) {
            textblock_append(tb,"Your chance of success is %d.%d%%\n",
                             (long)(1000 - wVar41) / 10 & 0xffffffff,
                             (long)(1000 - wVar41) % 10 & 0xffffffff);
          }
        }
        textblock_append(tb,"\n");
        bVar46 = true;
      }
      else if (peVar20 != (effect *)0x0) {
        _Var9 = tval_is_wand(obj);
        if (!_Var9) {
          _Var10 = tval_is_rod(obj);
          wVar41 = L'\0';
          iVar15 = 0;
          iVar28 = 0;
          _Var9 = false;
          if (!_Var10) goto LAB_001912b7;
        }
        _Var9 = true;
        wVar41 = L'\0';
        iVar15 = 0;
        iVar28 = 0;
        goto LAB_001912b7;
      }
    }
LAB_001915dc:
    if ((mode & 2U) == 0) goto LAB_00191d48;
    poVar22 = equipped_item_by_slot_name(player,"shooting");
    _Var9 = tval_is_melee_weapon(obj);
    bVar47 = (player->state).ammo_tval == (uint)obj->tval;
    if (_Var9) {
      _Var10 = flag_has_dbg(obj->flags,6,0x29,"obj->flags","OF_THROWING");
    }
    else {
      _Var10 = false;
    }
    _Var11 = tval_is_ammo(obj);
    if (_Var11) {
      _Var11 = flag_has_dbg(obj->flags,6,0x29,"obj->flags","OF_THROWING");
    }
    else {
      _Var11 = false;
    }
    poVar23 = equipped_item_by_slot_name(player,"shooting");
    _Var12 = tval_is_melee_weapon(obj);
    bVar45 = (player->state).ammo_tval != (uint)obj->tval;
    local_5b4 = 0;
    if (_Var12) {
      _Var13 = false;
    }
    else {
      _Var13 = false;
      if (poVar23 == (object *)0x0 || bVar45) {
        _Var13 = tval_is_potion(obj);
        if (((_Var13) && (obj->dd != '\0')) && (obj->ds != '\0')) {
          _Var13 = object_flavor_is_aware(obj);
        }
        else {
          _Var13 = false;
        }
      }
    }
    if (poVar23 != (object *)0x0 && !bVar45) {
      uVar34 = (player->state).ammo_mult * 2 + 0xc;
      local_5b4 = (uint)z_info->max_range;
      if ((int)uVar34 < (int)(uint)z_info->max_range) {
        local_5b4 = uVar34;
      }
      local_5b4 = local_5b4 * 5;
    }
    bVar45 = bVar47 && poVar22 != (object *)0x0;
    wVar41 = breakage_chance(obj,true);
    if (_Var12) {
      wVar26 = slot_by_name(player,"weapon");
      poVar23 = equipped_item_by_slot_name(player,"weapon");
      (player->body).slots[wVar26].obj = obj;
      ppVar8 = player;
      memcpy((player_state_conflict *)loot_spot,&player->state,0x13c);
      loot_spot[0x14] = '\0';
      loot_spot[0x15] = '\0';
      loot_spot[0x16] = '\0';
      loot_spot[0x17] = '\0';
      loot_spot[0x20] = '\0';
      loot_spot[0x21] = '\0';
      loot_spot[0x22] = '\0';
      loot_spot[0x23] = '\0';
      calc_bonuses(ppVar8,(player_state_conflict *)loot_spot,true,false);
      (player->body).slots[wVar26].obj = poVar23;
    }
    else {
      local_313 = false;
    }
    if ((_Var9 || bVar47 && poVar22 != (object *)0x0) || _Var11 != false) {
      textblock_append_c(tb,'\t',"Combat info:\n");
      if (local_313 != false) {
        textblock_append_c(tb,'\f',"You are too weak to use this weapon.\n");
      }
      wVar26 = slot_by_name(player,"weapon");
      poVar22 = slot_object(player,wVar26);
      _Var12 = tval_is_melee_weapon(obj);
      if (_Var12) {
        (player->body).slots[wVar26].obj = obj;
        ppVar8 = player;
        memcpy((player_state_conflict *)list,&player->state,0x13c);
        list[0x14] = false;
        list[0x15] = false;
        list[0x16] = false;
        list[0x17] = false;
        iVar14 = 0;
        iVar28 = 1;
        calc_bonuses(ppVar8,(player_state_conflict *)list,true,false);
        loot_spot._8_4_ = local_48c;
        iVar15 = 0x26 - list._20_4_;
        if (iVar15 < 1) {
          iVar15 = 0;
        }
        iVar24 = -1;
        for (; iVar14 != 0x26; iVar14 = iVar14 + 1) {
          for (iVar35 = 0; iVar15 != iVar35; iVar35 = iVar35 + 1) {
            if (iVar28 == 0x4c) {
              iVar28 = 0x4c;
              goto LAB_00191a62;
            }
            list._20_4_ = iVar35;
            calc_bonuses(player,(player_state_conflict *)list,true,false);
            iVar30 = local_48c - local_48c % 10;
            if ((local_48c - local_48c % 10 < iVar30) && (iVar35 < iVar24 || iVar24 == -1)) {
              lVar25 = (long)iVar28 * 0xc;
              *(int *)(loot_spot + lVar25) = iVar35;
              *(int *)(loot_spot + lVar25 + 4) = iVar14;
              *(int *)(loot_spot + lVar25 + 8) = iVar30;
              iVar28 = iVar28 + 1;
              iVar24 = iVar35;
              break;
            }
          }
        }
LAB_00191a62:
        (player->body).slots[wVar26].obj = poVar22;
        if (iVar28 != 0) {
          piVar44 = (int *)(loot_spot + 0x14);
          textblock_append_c(tb,'\r',"%d.%d ",(long)(int)loot_spot._8_4_ / 100 & 0xffffffff,
                             (long)((ulong)(uint)((int)((long)(int)loot_spot._8_4_ / 10) >> 0x1f) <<
                                    0x20 | (long)(int)loot_spot._8_4_ / 10 & 0xffffffffU) % 10 &
                             0xffffffff);
          pcVar31 = "";
          if (100 < (int)loot_spot._8_4_) {
            pcVar31 = "s";
          }
          textblock_append(tb,"blow%s/round.\n",pcVar31);
          for (lVar25 = 1; lVar25 < iVar28; lVar25 = lVar25 + 1) {
            iVar15 = *piVar44;
            if (iVar15 % 10 == 0) {
              textblock_append(tb,"With +%d STR and +%d DEX you would get %d.%d blows\n",
                               (ulong)(uint)piVar44[-2],(ulong)(uint)piVar44[-1],
                               (long)iVar15 / 100 & 0xffffffff,
                               (long)((ulong)(uint)((int)((long)iVar15 / 10) >> 0x1f) << 0x20 |
                                     (long)iVar15 / 10 & 0xffffffffU) % 10 & 0xffffffff);
            }
            else {
              textblock_append(tb,"With +%d STR and +%d DEX you would attack a bit faster\n",
                               (ulong)(uint)piVar44[-2],(ulong)(uint)piVar44[-1]);
            }
            piVar44 = piVar44 + 3;
          }
        }
      }
      if (bVar45) {
        textblock_append(tb,"When fired, hits targets up to ");
        textblock_append_c(tb,'\r',"%d",(ulong)local_5b4);
        textblock_append(tb," feet away.\n");
      }
      if (_Var9 || bVar45) {
        describe_damage(tb,obj,false);
      }
      if (_Var10 != false || _Var11 != false) {
        describe_damage(tb,obj,true);
      }
      if (bVar45) {
        textblock_append_c(tb,'\r',"%d%%",(ulong)(uint)wVar41);
        pcVar31 = " chance of breaking upon contact.\n";
LAB_00191c08:
        textblock_append(tb,pcVar31);
      }
      textblock_append(tb,"\n");
      bVar46 = true;
    }
    else if (_Var13 != false) {
      pcVar31 = "It can be thrown at creatures with damaging effect.\n";
      goto LAB_00191c08;
    }
    if ((mode & 3U) != 2) goto LAB_00191d48;
    _Var9 = tval_is_wearable(obj);
    if (((_Var9) && ((_Var9 = tval_is_melee_weapon(obj), _Var9 || (0 < obj->modifiers[8])))) &&
       ((_Var9 = tval_is_melee_weapon(obj), _Var9 || (obj->known->modifiers[8] != 0)))) {
      wVar41 = wield_slot(obj);
      poVar22 = slot_object(player,wVar41);
      (player->body).slots[wVar41].obj = obj;
      ppVar8 = player;
      memcpy((player_state_conflict *)loot_spot,&player->state,0x13c);
      loot_spot[0x14] = '\0';
      loot_spot[0x15] = '\0';
      loot_spot[0x16] = '\0';
      loot_spot[0x17] = '\0';
      loot_spot[0x20] = '\0';
      loot_spot[0x21] = '\0';
      loot_spot[0x22] = '\0';
      loot_spot[0x23] = '\0';
      calc_bonuses(ppVar8,(player_state_conflict *)loot_spot,true,false);
      (player->body).slots[wVar41].obj = poVar22;
      calc_digging_chances((player_state_conflict *)loot_spot,(int *)list);
      for (lVar25 = 0; lVar25 != 5; lVar25 = lVar25 + 1) {
        iVar28 = *(int *)(list + lVar25 * 4);
        if (iVar28 == 0) {
          uVar34 = 0;
        }
        else {
          if (0x63f < iVar28) {
            iVar28 = 0x640;
          }
          uVar34 = (uint)(16000 / (long)iVar28);
        }
        local_598[lVar25] = uVar34;
      }
      puVar40 = &describe_digger_names;
      for (lVar25 = 0; lVar25 != 0x10; lVar25 = lVar25 + 4) {
        if ((lVar25 == 0) && (0 < (int)local_598[0])) {
          _Var9 = tval_is_melee_weapon(obj);
          pcVar31 = "With this item, your current weapon clears ";
          if (_Var9) {
            pcVar31 = "Clears ";
          }
          pcVar38 = ", ";
LAB_00191dff:
          textblock_append(tb,pcVar31);
        }
        else {
          pcVar31 = "and ";
          pcVar38 = ".\n";
          if (lVar25 == 0xc) goto LAB_00191dff;
          pcVar38 = ", ";
          if (lVar25 != 0) {
            pcVar31 = "and ";
            pcVar38 = ", ";
            if (*(int *)((long)local_598 + lVar25) == 0) goto LAB_00191dff;
          }
        }
        uVar34 = *(uint *)((long)local_598 + lVar25);
        if (uVar34 == 0) {
          textblock_append_c(tb,'\f',"doesn\'t affect ");
          textblock_append(tb,"%s.\n",*puVar40);
          break;
        }
        textblock_append(tb,"%s in ",*puVar40);
        if (uVar34 == 10) {
          textblock_append_c(tb,'\r',"1 ");
          pcVar31 = "";
        }
        else {
          if ((int)uVar34 < 100) {
            textblock_append_c(tb,'\x05',"%d.%d ",(long)(int)uVar34 / 10 & 0xffffffff,
                               (long)(int)uVar34 % 10 & 0xffffffff);
          }
          else {
            attr = '\x04';
            if (uVar34 < 1000) {
              attr = '\v';
            }
            textblock_append_c(tb,attr,"%d ",(ulong)(uVar34 + 5) / 10);
          }
          pcVar31 = "s";
        }
        textblock_append(tb,"turn%s%s",pcVar31,pcVar38);
        puVar40 = puVar40 + 1;
      }
      bVar46 = true;
      goto LAB_00191d48;
    }
  }
  else {
LAB_00191d48:
    if ((mode & 1U) != 0) {
      return tb;
    }
  }
  if (bVar46) {
    textblock_append(tb,"\n%s\n",kb_info[obj->tval].text);
  }
  else {
    pcVar31 = "\n\nThis item does not seem to possess any special abilities.";
LAB_001900ea:
    textblock_append(tb,pcVar31);
  }
  return tb;
}

Assistant:

static textblock *object_info_out(const struct object *obj, int mode)
{
	bitflag flags[OF_SIZE];
	struct element_info el_info[ELEM_MAX];
	bool something = false;

	bool terse = mode & OINFO_TERSE ? true : false;
	bool subjective = mode & OINFO_SUBJ ? true : false;
	bool ego = mode & OINFO_EGO ? true : false;
	textblock *tb = textblock_new();

	assert(obj->known);

	/* Unaware objects get simple descriptions */
	if (obj->kind != obj->known->kind) {
		textblock_append(tb, "\n\nYou do not know what this is.\n");
		return tb;
	}

	/* Grab the object flags */
	get_known_flags(obj, mode, flags);

	/* Grab the element info */
	get_known_elements(obj, mode, el_info);

	if (subjective) describe_origin(tb, obj, terse);
	if (!terse) describe_flavor_text(tb, obj, ego);

	if (!object_fully_known(obj) &&	(obj->known->notice & OBJ_NOTICE_ASSESSED) && !tval_is_useable(obj)) {
		textblock_append(tb, "You do not know the full extent of this item's powers.\n");
		something = true;
	}

	if (describe_set(tb, obj)) something = true;
	if (describe_curses(tb, obj, flags)) something = true;
	if (describe_stats(tb, obj, mode)) something = true;
	if (describe_slays(tb, obj)) something = true;
	if (describe_brands(tb, obj)) something = true;
	if (describe_elements(tb, el_info)) something = true;
	if (describe_protects(tb, flags)) something = true;
	if (describe_ignores(tb, el_info)) something = true;
	if (describe_hates(tb, el_info)) something = true;
	if (describe_sustains(tb, flags)) something = true;
	if (describe_misc_magic(tb, flags)) something = true;
	if (describe_light(tb, obj, mode)) something = true;
	if (describe_book(tb, obj, mode)) something = true;
	if (ego && describe_ego(tb, obj->ego)) something = true;
	if (something) textblock_append(tb, "\n");

	/* Skip all the very specific information where we are giving general
	   ego knowledge rather than for a single item - abilities can vary */
	if (!ego) {
		if (describe_effect(tb, obj, terse, subjective)) {
			something = true;
			textblock_append(tb, "\n");
		}

		if (subjective && describe_combat(tb, obj)) {
			something = true;
			textblock_append(tb, "\n");
		}

		if (!terse && subjective && describe_digger(tb, obj)) something = true;
	}

	/* Don't append anything in terse (for chararacter dump) */
	if (!terse) {
		if (!something) {
			textblock_append(tb, "\n\nThis item does not seem to possess any special abilities.");
		} else {
			textblock_append(tb, "\n%s\n", kb_info[obj->tval].text);
		}
	}

	return tb;
}